

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialize_node<char_const*,short,unsigned_int>
               (IsoTree *node,char **in,vector<char,_std::allocator<char>_> *buffer,bool diff_endian
               )

{
  byte bVar1;
  double *pdVar2;
  double data_doubles [6];
  size_t data_sizets [4];
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  size_t local_48;
  size_t local_40;
  size_t sStack_38;
  size_t local_30;
  
  if (!interrupt_switch) {
    bVar1 = **in;
    *in = *in + 1;
    node->col_type = (uint)bVar1;
    read_bytes<int,short>(&node->chosen_cat,1,in,buffer,diff_endian);
    pdVar2 = (double *)*in;
    local_78 = *pdVar2;
    dStack_70 = pdVar2[1];
    local_68 = pdVar2[2];
    dStack_60 = pdVar2[3];
    local_58 = pdVar2[4];
    dStack_50 = pdVar2[5];
    *in = (char *)(pdVar2 + 6);
    if (diff_endian) {
      swap_endianness<double>(&local_78,6);
    }
    node->num_split = local_78;
    node->pct_tree_left = dStack_70;
    node->score = local_68;
    node->range_low = dStack_60;
    node->range_high = local_58;
    node->remainder = dStack_50;
    read_bytes<unsigned_long,unsigned_int>(&local_48,4,in,buffer,diff_endian);
    node->col_num = local_48;
    node->tree_left = local_40;
    node->tree_right = sStack_38;
    read_bytes<signed_char>(&node->cat_split,local_30,in);
  }
  return;
}

Assistant:

void deserialize_node(IsoTree &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    uint8_t data_en;
    read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
    node.col_type = (ColType)data_en;

    read_bytes<int, saved_int_t>((void*)&node.chosen_cat, (size_t)1, in, buffer, diff_endian);

    double data_doubles[6];
    read_bytes<double, double>((void*)data_doubles, (size_t)6, in, buffer, diff_endian);
    node.num_split = data_doubles[0];
    node.pct_tree_left = data_doubles[1];
    node.score = data_doubles[2];
    node.range_low = data_doubles[3];
    node.range_high = data_doubles[4];
    node.remainder = data_doubles[5];

    size_t data_sizets[4];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)4, in, buffer, diff_endian);
    node.col_num = data_sizets[0];
    node.tree_left = data_sizets[1];
    node.tree_right = data_sizets[2];
    read_bytes<signed char, signed char>(node.cat_split, data_sizets[3], in, buffer, diff_endian);
}